

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O2

void __thiscall sznet::TimerQueue::expiredProcess(TimerQueue *this,Timestamp now)

{
  MinHeap<sznet::Timer> *this_00;
  Timer *this_01;
  uint uVar1;
  ulong uVar2;
  int64_t iVar3;
  int64_t iVar4;
  size_type sVar5;
  char *__assertion;
  undefined1 local_58 [8];
  ActiveTimer activeTimer;
  Timestamp local_40;
  Timestamp now_local;
  
  local_40.m_microSecondsSinceEpoch = now.m_microSecondsSinceEpoch;
  net::EventLoop::assertInLoopThread(this->m_loop);
  uVar2 = (ulong)(this->m_timerMinHeap).m_size;
  if ((this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count == uVar2) {
    activeTimer.second = (long)&this->m_activeTimers;
    this_00 = &this->m_timerMinHeap;
    now_local.m_microSecondsSinceEpoch = (int64_t)this;
    while (uVar1 = (uint)uVar2, uVar1 != 0) {
      this_01 = *this_00->m_ptrArr;
      if (this_01 == (Timer *)0x0) goto LAB_0011372f;
      local_58 = (undefined1  [8])(this_01->m_expiration).m_microSecondsSinceEpoch;
      iVar3 = Timestamp::microSecondsSinceEpoch((Timestamp *)local_58);
      iVar4 = Timestamp::microSecondsSinceEpoch(&local_40);
      if (iVar4 < iVar3) {
        uVar1 = *(uint *)(now_local.m_microSecondsSinceEpoch + 0x10);
        this = (TimerQueue *)now_local;
        goto LAB_0011372f;
      }
      activeTimer.first = (Timer *)this_01->m_sequence;
      local_58 = (undefined1  [8])this_01;
      MinHeap<sznet::Timer>::pop(this_00);
      sVar5 = std::
              _Rb_tree<std::pair<sznet::Timer_*,_long>,_std::pair<sznet::Timer_*,_long>,_std::_Identity<std::pair<sznet::Timer_*,_long>_>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
              ::erase((_Rb_tree<std::pair<sznet::Timer_*,_long>,_std::pair<sznet::Timer_*,_long>,_std::_Identity<std::pair<sznet::Timer_*,_long>_>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
                       *)activeTimer.second,(key_type *)local_58);
      if (sVar5 != 1) {
        __assertion = "n == 1";
        uVar1 = 0x71;
        goto LAB_0011375e;
      }
      std::function<void_()>::operator()(&this_01->m_callback);
      if (this_01->m_repeat == true) {
        Timer::restart(this_01,local_40);
        this = (TimerQueue *)now_local;
        addTimerInLoop((TimerQueue *)now_local.m_microSecondsSinceEpoch,this_01);
      }
      else {
        std::_Function_base::~_Function_base(&(this_01->m_callback).super__Function_base);
        operator_delete(this_01);
        this = (TimerQueue *)now_local;
      }
      uVar2 = (ulong)(this->m_timerMinHeap).m_size;
    }
    uVar1 = 0;
LAB_0011372f:
    if ((this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count == (ulong)uVar1) {
      return;
    }
    __assertion = "m_timerMinHeap.size() == m_activeTimers.size()";
    uVar1 = 0x7e;
  }
  else {
    __assertion = "m_timerMinHeap.size() == m_activeTimers.size()";
    uVar1 = 0x62;
  }
LAB_0011375e:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                ,uVar1,"void sznet::TimerQueue::expiredProcess(Timestamp)");
}

Assistant:

void TimerQueue::expiredProcess(Timestamp now)
{
	m_loop->assertInLoopThread();
	assert(m_timerMinHeap.size() == m_activeTimers.size());
	while (true)
	{
		Timer* timer = m_timerMinHeap.top();
		if (!timer)
		{
			break;
		}
		if (timer->expiration().microSecondsSinceEpoch() > now.microSecondsSinceEpoch())
		{
			break;
		}
		ActiveTimer activeTimer(timer, timer->sequence());
		m_timerMinHeap.pop();
		size_t n = m_activeTimers.erase(activeTimer);
		assert(n == 1); (void)n;
		timer->run();
		if (timer->repeat())
		{
			timer->restart(now);
			addTimerInLoop(timer);
		}
		else 
		{
			delete timer;
			timer = nullptr;
		}
	}
	assert(m_timerMinHeap.size() == m_activeTimers.size());
}